

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  Ch *pCVar4;
  double *pdVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  byte *pbVar10;
  uint i;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  ulong i_00;
  byte bVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pcVar3 = is->src_;
  pCVar4 = is->head_;
  cVar2 = *pcVar3;
  pbVar10 = (byte *)(pcVar3 + (cVar2 == '-'));
  bVar16 = pcVar3[cVar2 == '-'];
  if (bVar16 == 0x30) {
    pbVar10 = pbVar10 + 1;
    uVar12 = 0;
    bVar8 = false;
    iVar11 = 0;
    i = 0;
    goto LAB_001062f9;
  }
  if ((byte)(bVar16 - 0x31) < 9) {
    i = bVar16 - 0x30;
    bVar16 = pbVar10[1];
    pbVar10 = pbVar10 + 1;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar16 - 0x30)) {
LAB_00106879:
        uVar12 = 0;
        bVar8 = false;
        iVar11 = 0;
        goto LAB_001062f9;
      }
      iVar11 = 0;
      do {
        if ((0xccccccb < i) && ('8' < (char)bVar16 || i != 0xccccccc)) goto LAB_001062f1;
        i = ((uint)bVar16 + i * 10) - 0x30;
        iVar11 = iVar11 + 1;
        bVar16 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
      } while ((byte)(bVar16 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar16 - 0x30)) goto LAB_00106879;
      iVar11 = 0;
      do {
        if ((0x19999998 < i) && ('5' < (char)bVar16 || i != 0x19999999)) goto LAB_001062f1;
        i = ((uint)bVar16 + i * 10) - 0x30;
        iVar11 = iVar11 + 1;
        bVar16 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
      } while ((byte)(bVar16 - 0x30) < 10);
    }
    bVar8 = false;
    uVar12 = 0;
    goto LAB_001062f9;
  }
  lVar9 = (long)pbVar10 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_00106873;
LAB_001062f1:
  bVar8 = true;
  uVar12 = i;
LAB_001062f9:
  i_00 = (ulong)uVar12;
  dVar18 = 0.0;
  if (bVar8) {
    bVar16 = *pbVar10;
    bVar14 = bVar16 - 0x30;
    if (cVar2 == '-') {
      while (bVar14 < 10) {
        if ((0xccccccccccccccb < i_00) && (i_00 != 0xccccccccccccccc || '8' < (char)bVar16))
        goto LAB_001063c1;
        i_00 = (ulong)(bVar16 & 0xf) + i_00 * 10;
        iVar11 = iVar11 + 1;
        bVar16 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
        bVar14 = bVar16 - 0x30;
      }
    }
    else {
      while (bVar14 < 10) {
        if ((0x1999999999999998 < i_00) && (i_00 != 0x1999999999999999 || '5' < (char)bVar16))
        goto LAB_001063c1;
        i_00 = (ulong)(bVar16 & 0xf) + i_00 * 10;
        iVar11 = iVar11 + 1;
        bVar16 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
        bVar14 = bVar16 - 0x30;
      }
    }
  }
  bVar6 = false;
  goto LAB_001063ea;
LAB_001063c1:
  auVar20._8_4_ = (int)(i_00 >> 0x20);
  auVar20._0_8_ = i_00;
  auVar20._12_4_ = 0x45300000;
  dVar18 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
  bVar6 = true;
LAB_001063ea:
  if (bVar6) {
    bVar16 = *pbVar10;
    while ((byte)(bVar16 - 0x30) < 10) {
      if (1.7976931348623158e+307 <= dVar18) {
        *(undefined4 *)(this + 0x30) = 0xd;
        goto LAB_001066dd;
      }
      dVar18 = dVar18 * 10.0 + (double)((char)*pbVar10 + -0x30);
      bVar16 = pbVar10[1];
      pbVar10 = pbVar10 + 1;
    }
  }
  bVar16 = *pbVar10;
  pbVar10 = pbVar10 + (bVar16 == 0x2e);
  iVar15 = 0;
  if (bVar16 == 0x2e) {
    if ((byte)(*pbVar10 - 0x3a) < 0xf6) {
      lVar9 = (long)pbVar10 - (long)pCVar4;
      *(undefined4 *)(this + 0x30) = 0xe;
LAB_00106873:
      *(long *)(this + 0x38) = lVar9;
      goto LAB_00106801;
    }
    iVar15 = 0;
    if (!bVar6) {
      uVar13 = (ulong)i;
      if (bVar8) {
        uVar13 = i_00;
      }
      i_00 = uVar13;
      bVar16 = *pbVar10;
      iVar15 = 0;
      if ((0xf5 < (byte)(bVar16 - 0x3a)) && (i_00 < 0x20000000000000)) {
        lVar9 = 0;
        do {
          i_00 = (ulong)(bVar16 & 0xf) + i_00 * 10;
          iVar11 = (uint)(i_00 != 0) + iVar11;
          bVar16 = pbVar10[lVar9 + 1];
          lVar9 = lVar9 + 1;
          if ((byte)(bVar16 - 0x3a) < 0xf6) break;
        } while (i_00 < 0x20000000000000);
        iVar15 = -(int)lVar9;
        pbVar10 = pbVar10 + lVar9;
      }
      auVar21._8_4_ = (int)(i_00 >> 0x20);
      auVar21._0_8_ = i_00;
      auVar21._12_4_ = 0x45300000;
      dVar18 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar16 = *pbVar10;
    while ((byte)(bVar16 - 0x30) < 10) {
      if (iVar11 < 0x11) {
        dVar18 = dVar18 * 10.0 + (double)(int)(bVar16 - 0x30);
        iVar15 = iVar15 + -1;
        if (0.0 < dVar18) {
          iVar11 = iVar11 + 1;
        }
      }
      pbVar1 = pbVar10 + 1;
      pbVar10 = pbVar10 + 1;
      bVar16 = *pbVar1;
    }
  }
  bVar16 = *pbVar10;
  pbVar10 = pbVar10 + (bVar16 == 0x65);
  if (bVar16 == 0x65) {
LAB_001065a1:
    uVar13 = (ulong)i;
    if (bVar8) {
      uVar13 = i_00;
    }
    if (!bVar6) {
      auVar22._8_4_ = (int)(uVar13 >> 0x20);
      auVar22._0_8_ = uVar13;
      auVar22._12_4_ = 0x45300000;
      dVar18 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar16 = *pbVar10;
    pbVar10 = pbVar10 + (bVar16 == 0x2b);
    bVar17 = false;
    if (bVar16 != 0x2b) {
      bVar17 = *pbVar10 == 0x2d;
      pbVar10 = pbVar10 + bVar17;
    }
    bVar16 = *pbVar10;
    if ((byte)(bVar16 - 0x30) < 10) {
      pbVar10 = pbVar10 + 1;
      iVar11 = bVar16 - 0x30;
      if (bVar17) {
        bVar16 = *pbVar10;
        while ((byte)(bVar16 - 0x30) < 10) {
          iVar11 = (uint)bVar16 + iVar11 * 10 + -0x30;
          if (iVar11 < 0xccccccc) {
            pbVar10 = pbVar10 + 1;
          }
          else {
            do {
              pbVar1 = pbVar10 + 1;
              pbVar10 = pbVar10 + 1;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
          bVar16 = *pbVar10;
        }
      }
      else {
        do {
          bVar16 = *pbVar10;
          bVar14 = bVar16 - 0x30;
          if (9 < bVar14) goto LAB_001066b7;
          pbVar10 = pbVar10 + 1;
          iVar11 = (uint)bVar16 + iVar11 * 10 + -0x30;
        } while (iVar11 <= 0x134 - iVar15);
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = (long)pcVar3 - (long)pCVar4;
LAB_001066b7:
        if (bVar14 < 10) {
          bVar17 = false;
          goto LAB_00106701;
        }
      }
      iVar7 = -iVar11;
      if (!bVar17) {
        iVar7 = iVar11;
      }
      iVar11 = iVar7;
      bVar17 = true;
    }
    else {
      *(undefined4 *)(this + 0x30) = 0xf;
      *(long *)(this + 0x38) = (long)pbVar10 - (long)pCVar4;
      bVar17 = false;
      iVar11 = 0;
    }
LAB_00106701:
    if (!bVar17) goto LAB_00106801;
  }
  else {
    bVar16 = *pbVar10;
    pbVar10 = pbVar10 + (bVar16 == 0x45);
    iVar11 = 0;
    if (bVar16 == 0x45) goto LAB_001065a1;
  }
  if (bVar6) {
    uVar12 = iVar11 + iVar15;
    if ((int)uVar12 < -0x134) {
      dVar19 = 0.0;
      if (-0x269 < (int)uVar12) {
        dVar19 = (dVar18 / 1e+308) /
                 *(double *)(internal::Pow10(int)::e + (ulong)(-uVar12 - 0x134) * 8);
      }
    }
    else if ((int)uVar12 < 0) {
      dVar19 = dVar18 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar12 * 8);
    }
    else {
      dVar19 = dVar18 * *(double *)(internal::Pow10(int)::e + (ulong)uVar12 * 8);
    }
    if (cVar2 == '-') {
      dVar19 = -dVar19;
    }
    if ((handler->stack_).stackEnd_ < (handler->stack_).stackTop_ + 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
    }
    pdVar5 = (double *)(handler->stack_).stackTop_;
    (handler->stack_).stackTop_ = (char *)(pdVar5 + 2);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *pdVar5 = dVar19;
    ((char *)((long)pdVar5 + 0xe))[0] = '\x16';
    ((char *)((long)pdVar5 + 0xe))[1] = '\x02';
  }
  else {
    if (bVar8) {
      if (cVar2 == '-') {
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-i_00);
      }
      else {
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint64(handler,i_00);
      }
    }
    else if (cVar2 == '-') {
      bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int(handler,-i);
    }
    else {
      bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint(handler,i);
    }
    if (bVar8 == false) {
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_001066dd:
      *(long *)(this + 0x38) = (long)pcVar3 - (long)pCVar4;
    }
  }
LAB_00106801:
  is->src_ = (Ch *)pbVar10;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }